

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O1

void Cec2_ManDestroy(Cec2_Man_t *p)

{
  long lVar1;
  Gia_Man_t *pGVar2;
  word *__ptr;
  void **ppvVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int level;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  timespec ts;
  timespec local_40;
  
  if (p->pPars->fVerbose != 0) {
    level = 3;
    iVar5 = clock_gettime(3,&local_40);
    if (iVar5 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    lVar7 = p->timeSatUnsat + p->timeSatSat + p->timeSatUndec;
    lVar1 = p->timeStart;
    dVar9 = 0.0;
    lVar6 = lVar8 - lVar1;
    dVar11 = (double)lVar6;
    if (lVar6 != 0) {
      dVar9 = (dVar11 * 100.0) / dVar11;
    }
    dVar12 = (double)lVar7;
    dVar14 = 0.0;
    if (lVar8 != lVar1) {
      dVar14 = (dVar12 * 100.0) / dVar11;
    }
    dVar10 = (double)(lVar6 - (p->timeSim + lVar7 + p->timeRefine + p->timeExtra));
    dVar13 = 0.0;
    if (lVar8 != lVar1) {
      dVar13 = (dVar10 * 100.0) / dVar11;
    }
    Abc_Print(level,"%s =","SAT solving");
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar12 / 1000000.0,dVar14);
    Abc_Print(level,"%s =","  sat      ");
    dVar12 = 0.0;
    if (lVar8 != lVar1) {
      dVar12 = ((double)p->timeSatSat * 100.0) / dVar11;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatSat / 1000000.0,dVar12);
    Abc_Print(level,"%s =","  unsat    ");
    dVar12 = 0.0;
    if (lVar8 != lVar1) {
      dVar12 = ((double)p->timeSatUnsat * 100.0) / dVar11;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatUnsat / 1000000.0,dVar12);
    Abc_Print(level,"%s =","  fail     ");
    dVar12 = 0.0;
    if (lVar8 != lVar1) {
      dVar12 = ((double)p->timeSatUndec * 100.0) / dVar11;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatUndec / 1000000.0,dVar12);
    Abc_Print(level,"%s =","Simulation ");
    dVar12 = 0.0;
    if (lVar8 != lVar1) {
      dVar12 = ((double)p->timeSim * 100.0) / dVar11;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSim / 1000000.0,dVar12);
    Abc_Print(level,"%s =","Refinement ");
    dVar12 = 0.0;
    if (lVar8 != lVar1) {
      dVar12 = ((double)p->timeRefine * 100.0) / dVar11;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeRefine / 1000000.0,dVar12);
    Abc_Print(level,"%s =","Rollback   ");
    dVar12 = 0.0;
    if (lVar8 != lVar1) {
      dVar12 = ((double)p->timeExtra * 100.0) / dVar11;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeExtra / 1000000.0,dVar12);
    Abc_Print(level,"%s =","Other      ");
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar10 / 1000000.0,dVar13);
    Abc_Print(level,"%s =","TOTAL      ");
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar11 / 1000000.0,dVar9);
    fflush(_stdout);
  }
  pGVar2 = p->pAig;
  if (pGVar2->vSims != (Vec_Wrd_t *)0x0) {
    __ptr = pGVar2->vSims->pArray;
    if (__ptr != (word *)0x0) {
      free(__ptr);
      pGVar2->vSims->pArray = (word *)0x0;
    }
    if (pGVar2->vSims != (Vec_Wrd_t *)0x0) {
      free(pGVar2->vSims);
      pGVar2->vSims = (Vec_Wrd_t *)0x0;
    }
  }
  Gia_ManCleanMark01(p->pAig);
  satoko_destroy(p->pSat);
  Gia_ManStopP(&p->pNew);
  if (p->vFrontier != (Vec_Ptr_t *)0x0) {
    ppvVar3 = p->vFrontier->pArray;
    if (ppvVar3 != (void **)0x0) {
      free(ppvVar3);
      p->vFrontier->pArray = (void **)0x0;
    }
    if (p->vFrontier != (Vec_Ptr_t *)0x0) {
      free(p->vFrontier);
      p->vFrontier = (Vec_Ptr_t *)0x0;
    }
  }
  if (p->vFanins != (Vec_Ptr_t *)0x0) {
    ppvVar3 = p->vFanins->pArray;
    if (ppvVar3 != (void **)0x0) {
      free(ppvVar3);
      p->vFanins->pArray = (void **)0x0;
    }
    if (p->vFanins != (Vec_Ptr_t *)0x0) {
      free(p->vFanins);
      p->vFanins = (Vec_Ptr_t *)0x0;
    }
  }
  if (p->vNodesNew != (Vec_Int_t *)0x0) {
    piVar4 = p->vNodesNew->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vNodesNew->pArray = (int *)0x0;
    }
    if (p->vNodesNew != (Vec_Int_t *)0x0) {
      free(p->vNodesNew);
      p->vNodesNew = (Vec_Int_t *)0x0;
    }
  }
  if (p->vSatVars != (Vec_Int_t *)0x0) {
    piVar4 = p->vSatVars->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vSatVars->pArray = (int *)0x0;
    }
    if (p->vSatVars != (Vec_Int_t *)0x0) {
      free(p->vSatVars);
      p->vSatVars = (Vec_Int_t *)0x0;
    }
  }
  if (p->vObjSatPairs != (Vec_Int_t *)0x0) {
    piVar4 = p->vObjSatPairs->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vObjSatPairs->pArray = (int *)0x0;
    }
    if (p->vObjSatPairs != (Vec_Int_t *)0x0) {
      free(p->vObjSatPairs);
      p->vObjSatPairs = (Vec_Int_t *)0x0;
    }
  }
  if (p->vCexTriples != (Vec_Int_t *)0x0) {
    piVar4 = p->vCexTriples->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vCexTriples->pArray = (int *)0x0;
    }
    if (p->vCexTriples != (Vec_Int_t *)0x0) {
      free(p->vCexTriples);
      p->vCexTriples = (Vec_Int_t *)0x0;
    }
  }
  free(p);
  return;
}

Assistant:

void Cec2_ManDestroy( Cec2_Man_t * p )
{
    if ( p->pPars->fVerbose ) 
    {
        abctime timeTotal = Abc_Clock() - p->timeStart;
        abctime timeSat   = p->timeSatSat + p->timeSatUnsat + p->timeSatUndec;
        abctime timeOther = timeTotal - timeSat - p->timeSim - p->timeRefine - p->timeExtra;
//        Abc_Print( 1, "%d\n", p->Num );
        ABC_PRTP( "SAT solving", timeSat,          timeTotal );
        ABC_PRTP( "  sat      ", p->timeSatSat,    timeTotal );
        ABC_PRTP( "  unsat    ", p->timeSatUnsat,  timeTotal );
        ABC_PRTP( "  fail     ", p->timeSatUndec,  timeTotal );
        ABC_PRTP( "Simulation ", p->timeSim,       timeTotal );
        ABC_PRTP( "Refinement ", p->timeRefine,    timeTotal );
        ABC_PRTP( "Rollback   ", p->timeExtra,     timeTotal );
        ABC_PRTP( "Other      ", timeOther,        timeTotal );
        ABC_PRTP( "TOTAL      ", timeTotal,        timeTotal );
        fflush( stdout );
    }

    Vec_WrdFreeP( &p->pAig->vSims );
    //Vec_WrdFreeP( &p->pAig->vSimsPi );
    Gia_ManCleanMark01( p->pAig );
    satoko_destroy( p->pSat );
    Gia_ManStopP( &p->pNew );
    Vec_PtrFreeP( &p->vFrontier );
    Vec_PtrFreeP( &p->vFanins );
    Vec_IntFreeP( &p->vNodesNew );
    Vec_IntFreeP( &p->vSatVars );
    Vec_IntFreeP( &p->vObjSatPairs );
    Vec_IntFreeP( &p->vCexTriples );
    ABC_FREE( p );
}